

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::OurReader::decodeNumber(OurReader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  UInt64 value;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  bool bVar7;
  Value local_40;
  
  pbVar3 = (byte *)token->end_;
  cVar1 = *token->start_;
  bVar7 = cVar1 == '-';
  uVar4 = 0x1999999999999999;
  if (bVar7) {
    uVar4 = 0xccccccccccccccc;
  }
  pbVar5 = (byte *)(token->start_ + bVar7);
  if (pbVar5 < pbVar3) {
    value = 0;
    do {
      bVar2 = *pbVar5;
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
LAB_0012c4fd:
        bVar7 = decodeDouble(this,token,decoded);
        return bVar7;
      }
      pbVar5 = pbVar5 + 1;
      uVar6 = bVar2 - 0x30;
      if ((uVar4 <= value) &&
         (((uVar4 < value || (pbVar5 != pbVar3)) || ((uint)bVar7 * 3 + 5 < uVar6))))
      goto LAB_0012c4fd;
      value = (ulong)uVar6 + value * 10;
    } while (pbVar5 < pbVar3);
    if (cVar1 == '-') {
LAB_0012c4cf:
      value = -value;
    }
    else if ((long)value < 0) {
      Value::Value(&local_40,value);
      goto LAB_0012c4df;
    }
  }
  else {
    value = 0;
    if (cVar1 == '-') goto LAB_0012c4cf;
  }
  Value::Value(&local_40,value);
LAB_0012c4df:
  Value::operator=(decoded,&local_40);
  Value::~Value(&local_40);
  return true;
}

Assistant:

bool OurReader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  const bool isNegative = *current == '-';
  if (isNegative) {
    ++current;
  }

  // We assume we can represent the largest and smallest integer types as
  // unsigned integers with separate sign. This is only true if they can fit
  // into an unsigned integer.
  static_assert(Value::maxLargestInt <= Value::maxLargestUInt,
                "Int must be smaller than UInt");

  // We need to convert minLargestInt into a positive number. The easiest way
  // to do this conversion is to assume our "threshold" value of minLargestInt
  // divided by 10 can fit in maxLargestInt when absolute valued. This should
  // be a safe assumption.
  static_assert(Value::minLargestInt <= -Value::maxLargestInt,
                "The absolute value of minLargestInt must be greater than or "
                "equal to maxLargestInt");
  static_assert(Value::minLargestInt / 10 >= -Value::maxLargestInt,
                "The absolute value of minLargestInt must be only 1 magnitude "
                "larger than maxLargest Int");

  static constexpr Value::LargestUInt positive_threshold =
      Value::maxLargestUInt / 10;
  static constexpr Value::UInt positive_last_digit = Value::maxLargestUInt % 10;

  // For the negative values, we have to be more careful. Since typically
  // -Value::minLargestInt will cause an overflow, we first divide by 10 and
  // then take the inverse. This assumes that minLargestInt is only a single
  // power of 10 different in magnitude, which we check above. For the last
  // digit, we take the modulus before negating for the same reason.
  static constexpr auto negative_threshold =
      Value::LargestUInt(-(Value::minLargestInt / 10));
  static constexpr auto negative_last_digit =
      Value::UInt(-(Value::minLargestInt % 10));

  const Value::LargestUInt threshold =
      isNegative ? negative_threshold : positive_threshold;
  const Value::UInt max_last_digit =
      isNegative ? negative_last_digit : positive_last_digit;

  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);

    const auto digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, meaning value == threshold,
      // b) this is the last digit, or
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > max_last_digit) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }

  if (isNegative) {
    // We use the same magnitude assumption here, just in case.
    const auto last_digit = static_cast<Value::UInt>(value % 10);
    decoded = -Value::LargestInt(value / 10) * 10 - last_digit;
  } else if (value <= Value::LargestUInt(Value::maxLargestInt)) {
    decoded = Value::LargestInt(value);
  } else {
    decoded = value;
  }

  return true;
}